

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRDetector.cpp
# Opt level: O3

DetectorResult *
ZXing::QRCode::SampleQR
          (DetectorResult *__return_storage_ptr__,BitMatrix *image,FinderPatternSet *fp)

{
  double *pdVar1;
  PointT<double> *pPVar2;
  ulong *puVar3;
  BitMatrix *pBVar4;
  undefined8 uVar5;
  int *piVar6;
  pointer piVar7;
  PointT<double> b;
  pointer pPVar8;
  value_t val;
  FinderPatternSet *pFVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  Version *pVVar14;
  PointI PVar15;
  long lVar16;
  RegressionLine *pRVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  PointF *pPVar22;
  int iVar23;
  long lVar24;
  PointI PVar25;
  long lVar26;
  int x_1;
  uint uVar27;
  BitMatrix *pBVar28;
  value_t *pvVar29;
  undefined8 *puVar30;
  PerspectiveTransform *pPVar31;
  pointer pRVar32;
  int y;
  int iVar33;
  uint uVar34;
  long lVar35;
  BitMatrix *pBVar36;
  int x;
  ulong uVar37;
  ulong uVar38;
  bool bVar39;
  byte bVar40;
  undefined1 auVar41 [16];
  double dVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  double dVar46;
  double dVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  PointF PVar50;
  PointF p;
  PointF p_00;
  PointF p_01;
  PointF estimate;
  PointF p_03;
  PointF p_04;
  PointF PVar51;
  PointF p_06;
  Matrix<std::optional<ZXing::PointT<double>_>_> apP;
  ROIs rois;
  optional<ZXing::PointT<double>_> brCP;
  vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_> hori;
  PerspectiveTransform mod2Pix;
  DimensionEstimate left;
  DimensionEstimate top;
  RegressionLine tr3;
  RegressionLine tr2;
  RegressionLine bl3;
  RegressionLine bl2;
  Matrix<std::optional<ZXing::PointT<double>_>_> local_388;
  vector<ZXing::ROI,_std::allocator<ZXing::ROI>_> local_368;
  PointF local_348;
  uint local_334;
  FinderPatternSet *local_330;
  BitMatrix *local_328;
  BitMatrix *pBStack_320;
  BitMatrix *local_318;
  BitMatrix *pBStack_310;
  ulong local_300;
  PointI local_2f8;
  double local_2f0;
  undefined1 local_2e8 [8];
  undefined8 uStack_2e0;
  undefined1 local_2d8 [80];
  DetectorResult *local_288;
  long local_280;
  QuadrilateralF local_278;
  ulong local_230;
  RegressionLine local_228;
  PerspectiveTransform local_1e0;
  DimensionEstimate local_198;
  DimensionEstimate local_180;
  RegressionLine local_168;
  RegressionLine local_128;
  RegressionLine local_e8;
  RegressionLine local_a8;
  PointF local_68;
  PointF local_58;
  pointer local_48;
  double dStack_40;
  undefined1 local_38;
  uint7 uStack_37;
  PointF p_02;
  PointF p_05;
  
  bVar40 = 0;
  EstimateDimension(&local_180,image,fp->tl,fp->tr);
  local_330 = fp;
  EstimateDimension(&local_198,image,fp->tl,fp->bl);
  pFVar9 = local_330;
  if (local_180.dim == 0 && local_198.dim == 0) {
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->_bits)._width = 0;
    (__return_storage_ptr__->_bits)._height = 0;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    return __return_storage_ptr__;
  }
  local_318 = (BitMatrix *)local_180.ms;
  uVar19 = local_180.dim;
  if (local_180.dim <= local_198.dim) {
    local_318 = (BitMatrix *)local_198.ms;
    uVar19 = local_198.dim;
  }
  if (local_180.err < local_198.err) {
    local_198.dim = local_180.dim;
  }
  uVar11 = local_198.dim;
  if (local_180.err == local_198.err) {
    uVar11 = uVar19;
  }
  PVar25.y = 0;
  PVar25.x = uVar11;
  if (local_198.err <= local_180.err) {
    local_180.ms = local_198.ms;
  }
  if (local_180.err != local_198.err) {
    local_318 = (BitMatrix *)local_180.ms;
  }
  iVar23 = local_180.err;
  TraceLine(&local_a8,image,(local_330->bl).super_PointF,(local_330->tl).super_PointF,2);
  TraceLine(&local_e8,image,(pFVar9->bl).super_PointF,(pFVar9->tl).super_PointF,3);
  TraceLine(&local_128,image,(pFVar9->tr).super_PointF,(pFVar9->tl).super_PointF,2);
  TraceLine(&local_168,image,(pFVar9->tr).super_PointF,(pFVar9->tl).super_PointF,3);
  local_334 = (uint)((double)local_318 + 1.0);
  if ((((NAN(local_a8.a)) || (NAN(local_128.a))) || (NAN(local_e8.a))) || (NAN(local_168.a))) {
LAB_00184ece:
    local_228.b = (local_330->bl).super_PointF.x;
    local_228.c = (local_330->bl).super_PointF.y;
    local_228._points.
    super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)(local_330->tl).super_PointF.x;
    local_228._points.
    super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)(local_330->tl).super_PointF.y;
    local_228._points.
    super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(local_330->tr).super_PointF.x;
    local_228._directionInward.x = (local_330->tr).super_PointF.y;
    local_328 = (BitMatrix *)
                (((double)local_228._points.
                          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                 (double)local_228._points.
                         super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) + local_228.b);
    pBStack_320 = (BitMatrix *)
                  ((local_228._directionInward.x -
                   (double)local_228._points.
                           super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) + local_228.c);
    local_2f0 = 0.0;
  }
  else {
    dVar46 = local_168.b * local_e8.a - local_e8.b * local_168.a;
    dVar47 = local_128.b * local_a8.a - local_a8.b * local_128.a;
    auVar43._0_8_ = local_168.b * local_e8.c - local_168.c * local_e8.b;
    auVar43._8_8_ = local_128.c * local_a8.a - local_128.a * local_a8.c;
    auVar44._8_8_ = dVar47;
    auVar44._0_8_ = dVar46;
    auVar44 = divpd(auVar43,auVar44);
    auVar48._0_8_ = local_128.b * local_a8.c - local_128.c * local_a8.b;
    auVar48._8_8_ = local_168.c * local_e8.a - local_168.a * local_e8.c;
    auVar49._8_8_ = dVar46;
    auVar49._0_8_ = dVar47;
    auVar49 = divpd(auVar48,auVar49);
    local_318 = (BitMatrix *)((auVar49._0_8_ + auVar44._0_8_) * 0.5);
    pBStack_310 = (BitMatrix *)((auVar49._8_8_ + auVar44._8_8_) * 0.5);
    local_328 = (BitMatrix *)0xbff0000000000000;
    pBStack_320 = (BitMatrix *)0xbff0000000000000;
    if (((int)uVar11 < 0x16) ||
       (PVar50.y = (double)pBStack_310, PVar50.x = (double)local_318,
       LocateAlignmentPattern
                 ((optional<ZXing::PointT<double>_> *)local_2e8,(QRCode *)image,
                  (BitMatrix *)(ulong)local_334,iVar23,PVar50), (bool)local_2d8[0] == false)) {
LAB_00184dba:
      iVar23 = (local_330->bl).size;
      iVar18 = (local_330->tl).size;
      iVar33 = iVar23;
      if (iVar18 < iVar23) {
        iVar33 = iVar18;
      }
      iVar10 = (local_330->tr).size;
      if (iVar10 < iVar33) {
        iVar33 = iVar10;
      }
      if (iVar18 < iVar23) {
        iVar18 = iVar23;
      }
      if (iVar18 <= iVar10) {
        iVar18 = iVar10;
      }
      if ((1.1 < (double)iVar18 / (double)iVar33) ||
         ((((bVar39 = RegressionLine::isHighRes(&local_a8), bVar39 &&
            (bVar39 = RegressionLine::isHighRes(&local_e8), bVar39)) &&
           (bVar39 = RegressionLine::isHighRes(&local_128), bVar39)) &&
          (bVar39 = RegressionLine::isHighRes(&local_168), bVar39)))) {
        local_328 = local_318;
        pBStack_320 = pBStack_310;
      }
    }
    else {
      local_328 = (BitMatrix *)local_2e8;
      pBStack_320 = (BitMatrix *)uStack_2e0;
      if ((((double)local_2e8 < 0.0) ||
          (((double)image->_width <= (double)local_2e8 || ((double)uStack_2e0 < 0.0)))) ||
         ((double)image->_height <= (double)uStack_2e0)) goto LAB_00184dba;
    }
    if ((((double)local_328 < 0.0) || ((double)image->_width <= (double)local_328)) ||
       (((double)pBStack_320 < 0.0 || ((double)image->_height <= (double)pBStack_320))))
    goto LAB_00184ece;
    local_228.b = (local_330->bl).super_PointF.x;
    local_228.c = (local_330->bl).super_PointF.y;
    local_228._points.
    super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)(local_330->tl).super_PointF.x;
    local_228._points.
    super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)(local_330->tl).super_PointF.y;
    local_228._points.
    super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(local_330->tr).super_PointF.x;
    local_228._directionInward.x = (local_330->tr).super_PointF.y;
    local_2f0 = 3.0;
  }
  local_2d8._0_8_ = (double)(int)uVar11 + -3.5;
  local_2e8 = (undefined1  [8])0x400c000000000000;
  uStack_2e0 = 3.5;
  local_2d8._8_8_ = 3.5;
  local_2d8._32_8_ = 3.5;
  local_2d8._16_8_ = (double)local_2d8._0_8_ - local_2f0;
  local_2d8._24_8_ = local_2d8._16_8_;
  local_2d8._40_8_ = local_2d8._0_8_;
  local_228._directionInward.y = (double)local_328;
  local_228.a = (value_t_conflict)pBStack_320;
  PerspectiveTransform::PerspectiveTransform
            (&local_1e0,(QuadrilateralF *)local_2e8,(QuadrilateralF *)&local_228);
  if ((int)uVar11 < 0x2d) {
    SampleGrid(__return_storage_ptr__,image,uVar11,uVar11,&local_1e0);
  }
  else {
    local_288 = __return_storage_ptr__;
    local_2e8 = (undefined1  [8])0x0;
    local_228._points.
    super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT62(local_228._points.
                           super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._2_6_,0x100);
    dVar46 = 0.0;
    local_318 = image;
    local_2f8 = PVar25;
    do {
      local_348.x = dVar46;
      uVar38 = (ulong)*(byte *)((long)&local_228._points.
                                       super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + (long)dVar46);
      iVar33 = 5;
      iVar18 = 0;
      iVar23 = uVar11 - 9;
      do {
        iVar20 = iVar23;
        iVar10 = iVar33;
        if (uVar38 != 0) {
          iVar20 = iVar33;
          iVar10 = iVar23;
        }
        PVar51.x = (double)iVar20 + 0.5;
        PVar51.y = (double)iVar10 + 0.5;
        PVar50 = PerspectiveTransform::operator()(&local_1e0,PVar51);
        dVar47 = PVar50.y;
        dVar46 = PVar50.x;
        iVar10 = -1;
        if (((0.0 <= dVar46) && (dVar46 < (double)local_318->_width)) &&
           ((0.0 <= dVar47 && (dVar47 < (double)local_318->_height)))) {
          bVar39 = BitMatrix::get(local_318,(int)dVar46,(int)dVar47);
          iVar10 = (uint)bVar39 + iVar18 * 2;
        }
        iVar18 = iVar10;
        bVar39 = (int)(uVar11 - 0xb) < iVar23;
        iVar23 = iVar23 + -1;
      } while ((bVar39) || (bVar39 = iVar33 != 0, iVar33 = iVar33 + -1, iVar23 = uVar11 - 9, bVar39)
              );
      *(int *)(local_2e8 + uVar38 * 4) = iVar18;
      dVar46 = (double)((long)local_348.x + 1);
    } while (dVar46 != 9.88131291682493e-324);
    pVVar14 = Version::DecodeVersionInformation(local_2e8._0_4_,local_2e8._4_4_);
    __return_storage_ptr__ = local_288;
    PVar25 = local_2f8;
    pFVar9 = local_330;
    if (pVVar14 != (Version *)0x0) {
      PVar15 = Version::SymbolSize(pVVar14->_versionNumber,(pVVar14->_type == Micro) + Model2);
      uVar11 = PVar15.x - PVar25.x;
      uVar19 = -uVar11;
      if (0 < (int)uVar11) {
        uVar19 = uVar11;
      }
      if (uVar19 < 9) {
        PVar15 = Version::SymbolSize(pVVar14->_versionNumber,(pVVar14->_type == Micro) + Model2);
        if (PVar25.x != PVar15.x) {
          PVar25 = Version::SymbolSize(pVVar14->_versionNumber,(pVVar14->_type == Micro) + Model2);
          local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x =
               (pFVar9->tl).super_PointF.x;
          local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y =
               (pFVar9->tl).super_PointF.y;
          local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x =
               (pFVar9->tr).super_PointF.x;
          local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].y =
               (pFVar9->tr).super_PointF.y;
          local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].x = (double)local_328;
          local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].y = (double)pBStack_320;
          local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].x =
               (pFVar9->bl).super_PointF.x;
          local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].y =
               (pFVar9->bl).super_PointF.y;
          local_228._points.
          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)((double)PVar25.x + -3.5);
          local_228._points.
          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x400c000000000000;
          local_228._points.
          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl
          .super__Vector_impl_data._M_finish = (pointer)0x400c000000000000;
          local_228._directionInward.x = 3.5;
          local_228.b = 3.5;
          local_228._directionInward.y =
               (double)local_228._points.
                       super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage - local_2f0;
          local_228.a = local_228._directionInward.y;
          local_228.c = (value_t_conflict)
                        local_228._points.
                        super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
          PerspectiveTransform::PerspectiveTransform
                    ((PerspectiveTransform *)local_2e8,(QuadrilateralF *)&local_228,&local_278);
          pvVar29 = (value_t *)local_2e8;
          pPVar31 = &local_1e0;
          for (lVar21 = 9; lVar21 != 0; lVar21 = lVar21 + -1) {
            pPVar31->a11 = *pvVar29;
            pvVar29 = pvVar29 + (ulong)bVar40 * -2 + 1;
            pPVar31 = (PerspectiveTransform *)((long)pPVar31 + ((ulong)bVar40 * -2 + 1) * 8);
          }
        }
        local_38 = 0;
        iVar23 = (int)((ulong)((long)(pVVar14->_alignmentPatternCenters).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(pVVar14->_alignmentPatternCenters).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2);
        val.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
        super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._M_value.y = dStack_40;
        val.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
        super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._M_value.x =
             (double)local_48;
        val.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
        super__Optional_payload_base<ZXing::PointT<double>_>._16_8_ = (ulong)uStack_37 << 8;
        local_2f8 = PVar25;
        Matrix<std::optional<ZXing::PointT<double>_>_>::Matrix(&local_388,iVar23,iVar23,val);
        piVar6 = (pVVar14->_alignmentPatternCenters).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        piVar7 = (pVVar14->_alignmentPatternCenters).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        p.x = (double)*piVar6 + 0.5;
        p.y = p.x;
        PVar50 = PerspectiveTransform::operator()(&local_1e0,p);
        pBVar36 = local_318;
        *(PointF *)
         local_388._data.
         super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start = PVar50;
        *(undefined1 *)
         &((PointF *)
          ((long)local_388._data.
                 super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 0x10))->x = 1;
        local_348.x = PVar50.y;
        FindConcentricPatternCorners
                  ((optional<ZXing::Quadrilateral<ZXing::PointT<double>_>_> *)local_2e8,local_318,
                   (pFVar9->tl).super_PointF,(pFVar9->tl).size,2);
        uVar19 = (uint)((ulong)((long)piVar7 - (long)piVar6) >> 2);
        local_300 = (ulong)(uVar19 - 1);
        if (local_2d8[0x30] == true) {
          lVar21 = 0;
          do {
            dVar46 = *(double *)((long)&uStack_2e0 + lVar21);
            dVar47 = *(double *)(local_2e8 + lVar21) - PVar50.x;
            dVar42 = dVar46 - local_348.x;
            if (SQRT(dVar47 * dVar47 + dVar42 * dVar42) < (double)((pFVar9->tl).size / 2)) {
              *(double *)
               &(local_388._data.
                 super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
                super__Optional_base<ZXing::PointT<double>,_true,_true> =
                   *(double *)(local_2e8 + lVar21);
              *(double *)
               ((long)local_388._data.
                      super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 8) = dVar46;
              *(undefined1 *)
               &((PointF *)
                ((long)local_388._data.
                       super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 0x10))->x = 1;
            }
            lVar21 = lVar21 + 0x10;
          } while (lVar21 != 0x40);
        }
        piVar6 = (pVVar14->_alignmentPatternCenters).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar26 = (long)(int)(uVar19 - 1);
        p_00.x = (double)*piVar6 + 0.5;
        p_00.y = (double)piVar6[lVar26] + 0.5;
        PVar50 = PerspectiveTransform::operator()(&local_1e0,p_00);
        local_348.x = PVar50.y;
        lVar21 = local_388._width * lVar26;
        *(double *)
         ((long)local_388._data.
                super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar21 * 0x18) = PVar50.x;
        *(double *)
         ((long)local_388._data.
                super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar21 * 0x18 + 8) = local_348.x;
        *(undefined1 *)
         ((long)local_388._data.
                super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar21 * 0x18 + 0x10) = 1;
        FindConcentricPatternCorners
                  ((optional<ZXing::Quadrilateral<ZXing::PointT<double>_>_> *)local_2e8,pBVar36,
                   (pFVar9->bl).super_PointF,(pFVar9->bl).size,2);
        if (local_2d8[0x30] == true) {
          lVar21 = 0;
          do {
            dVar46 = *(double *)((long)&uStack_2e0 + lVar21);
            dVar47 = *(double *)(local_2e8 + lVar21) - PVar50.x;
            dVar42 = dVar46 - local_348.x;
            if (SQRT(dVar47 * dVar47 + dVar42 * dVar42) < (double)((pFVar9->bl).size / 2)) {
              pdVar1 = (double *)
                       ((long)local_388._data.
                              super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start +
                       local_388._width * lVar26 * 0x18);
              *pdVar1 = *(double *)(local_2e8 + lVar21);
              pdVar1[1] = dVar46;
              *(undefined1 *)
               ((long)local_388._data.
                      super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               local_388._width * lVar26 * 0x18 + 0x10) = 1;
            }
            lVar21 = lVar21 + 0x10;
          } while (lVar21 != 0x40);
        }
        piVar6 = (pVVar14->_alignmentPatternCenters).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        p_01.x = (double)piVar6[lVar26] + 0.5;
        p_01.y = (double)*piVar6 + 0.5;
        PVar50 = PerspectiveTransform::operator()(&local_1e0,p_01);
        *(double *)
         ((long)local_388._data.
                super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar26 * 0x18) = PVar50.x;
        *(double *)
         ((long)local_388._data.
                super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar26 * 0x18 + 8) = PVar50.y;
        *(undefined1 *)
         ((long)local_388._data.
                super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar26 * 0x18 + 0x10) = 1;
        local_348.x = PVar50.y;
        FindConcentricPatternCorners
                  ((optional<ZXing::Quadrilateral<ZXing::PointT<double>_>_> *)local_2e8,pBVar36,
                   (pFVar9->tr).super_PointF,(pFVar9->tr).size,2);
        if (local_2d8[0x30] == true) {
          lVar21 = 0;
          do {
            dVar46 = *(double *)((long)&uStack_2e0 + lVar21);
            dVar47 = *(double *)(local_2e8 + lVar21) - PVar50.x;
            dVar42 = dVar46 - local_348.x;
            if (SQRT(dVar47 * dVar47 + dVar42 * dVar42) < (double)((pFVar9->tr).size / 2)) {
              pdVar1 = (double *)
                       ((long)local_388._data.
                              super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar26 * 0x18);
              *pdVar1 = *(double *)(local_2e8 + lVar21);
              pdVar1[1] = dVar46;
              *(undefined1 *)
               ((long)local_388._data.
                      super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar26 * 0x18 + 0x10) = 1;
            }
            lVar21 = lVar21 + 0x10;
          } while (lVar21 != 0x40);
        }
        if (0 < (int)uVar19) {
          local_2f0 = -NAN;
          local_328 = (BitMatrix *)0x0;
          uVar38 = 0;
          local_230 = (ulong)(uVar19 & 0x7fffffff);
          do {
            local_280 = uVar38 - 1;
            lVar26 = -1;
            lVar21 = 0;
            lVar35 = 0;
            do {
              lVar16 = (long)local_388._width;
              if (*(char *)((long)local_388._data.
                                  super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start +
                           (uVar38 * lVar16 + lVar26) * 0x18 + 0x28) == '\0') {
                if (lVar21 == 0) {
                  piVar7 = (pVVar14->_alignmentPatternCenters).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  p_02.x = (double)piVar7[lVar26 + 1] + 0.5;
                  p_02.y = (double)piVar7[uVar38] + 0.5;
                  pPVar22 = (PointF *)
                            local_388._data.
                            super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  estimate = PerspectiveTransform::operator()(&local_1e0,p_02);
                  iVar23 = (int)pPVar22;
                }
                else {
                  if ((*(byte *)((long)local_388._data.
                                       super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start +
                                lVar35 + -8 + (long)local_328 * lVar16) & 1) == 0) {
                    piVar7 = (pVVar14->_alignmentPatternCenters).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    p_03.x = (double)piVar7[lVar26] + 0.5;
                    p_03.y = (double)piVar7[uVar38] + 0.5;
                    local_348 = PerspectiveTransform::operator()(&local_1e0,p_03);
                    lVar16 = (long)local_388._width;
                  }
                  else {
                    local_348 = *(PointF *)
                                 ((long)local_388._data.
                                        super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                 lVar35 + -0x18 + (long)local_328 * lVar16);
                  }
                  lVar24 = (long)local_2f0 * lVar16 + lVar26;
                  if ((*(byte *)((long)local_388._data.
                                       super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start +
                                lVar24 * 0x18 + 0x28) & 1) == 0) {
                    piVar7 = (pVVar14->_alignmentPatternCenters).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    p_04.x = (double)piVar7[lVar26 + 1] + 0.5;
                    p_04.y = (double)piVar7[uVar38 - 1] + 0.5;
                    PVar50 = PerspectiveTransform::operator()(&local_1e0,p_04);
                    lVar16 = local_388._width * local_280;
                  }
                  else {
                    lVar16 = lVar16 * local_280;
                    PVar50 = *(PointF *)
                              ((long)local_388._data.
                                     super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start +
                              lVar24 * 0x18 + 0x18);
                  }
                  pPVar22 = (PointF *)
                            local_388._data.
                            super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if ((*(byte *)((long)local_388._data.
                                       super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start +
                                (lVar16 + lVar26) * 0x18 + 0x10) & 1) == 0) {
                    piVar7 = (pVVar14->_alignmentPatternCenters).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    p_05.x = (double)piVar7[lVar26] + 0.5;
                    p_05.y = (double)piVar7[uVar38 - 1] + 0.5;
                    local_68 = PVar50;
                    PVar51 = PerspectiveTransform::operator()(&local_1e0,p_05);
                    PVar50 = local_68;
                  }
                  else {
                    PVar51 = *(PointF *)
                              ((long)local_388._data.
                                     super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start +
                              (lVar16 + lVar26) * 0x18);
                  }
                  iVar23 = (int)pPVar22;
                  estimate.y = (local_348.y + PVar50.y) - PVar51.y;
                  estimate.x = (local_348.x + PVar50.x) - PVar51.x;
                }
                LocateAlignmentPattern
                          ((optional<ZXing::PointT<double>_> *)local_2e8,(QRCode *)local_318,
                           (BitMatrix *)(ulong)local_334,iVar23,estimate);
                if ((bool)local_2d8[0] == true) {
                  pdVar1 = (double *)
                           ((long)&(local_388._data.
                                    super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Optional_base<ZXing::PointT<double>,_true,_true> +
                           lVar35 + (long)local_388._width * (long)local_328);
                  *pdVar1 = (double)local_2e8;
                  pdVar1[1] = (double)uStack_2e0;
                  *(undefined1 *)
                   ((long)&((PointF *)
                           ((long)local_388._data.
                                  super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 0x10))->x +
                   (long)local_388._width * (long)local_328 + lVar35) = 1;
                }
              }
              lVar35 = lVar35 + 0x18;
              lVar21 = lVar21 + uVar38;
              lVar16 = lVar26 - (ulong)(uVar19 & 0x7fffffff);
              lVar26 = lVar26 + 1;
            } while (lVar16 != -2);
            uVar38 = uVar38 + 1;
            local_328 = (BitMatrix *)((long)local_328 + 0x18);
            local_2f0 = (double)((long)local_2f0 + 1);
          } while (uVar38 != local_230);
          if (0 < (int)uVar19) {
            uVar12 = (int)local_300 * 2 + 2;
            uVar11 = 3;
            if (3 < (int)uVar12) {
              uVar11 = uVar12;
            }
            uVar12 = 0;
            do {
              uVar34 = 0;
              do {
                if (*(char *)((long)local_388._data.
                                    super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                             (long)(int)(local_388._width * uVar12 + uVar34) * 0x18 + 0x10) == '\0')
                {
                  local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x = 0.0;
                  local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y = 0.0;
                  local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x = 0.0;
                  local_368.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (ROI *)0x0;
                  local_368.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_368.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
                  super__Vector_impl_data._M_finish = (ROI *)0x0;
                  if (uVar19 != 1) {
                    uVar27 = 2;
                    do {
                      if (1 < (int)((ulong)((long)local_278.super_array<ZXing::PointT<double>,_4UL>.
                                                  _M_elems[0].y -
                                           (long)local_278.super_array<ZXing::PointT<double>,_4UL>.
                                                 _M_elems[0].x) >> 4)) break;
                      uVar13 = -(uVar27 >> 1);
                      if ((uVar27 & 1) != 0) {
                        uVar13 = uVar27 >> 1;
                      }
                      if ((uVar13 + uVar34 < uVar19) &&
                         (lVar21 = (long)(int)(local_388._width * uVar12 + uVar13 + uVar34),
                         *(char *)((long)local_388._data.
                                         super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start +
                                  lVar21 * 0x18 + 0x10) == '\x01')) {
                        pPVar2 = (PointT<double> *)
                                 ((long)local_388._data.
                                        super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar21 * 0x18);
                        if (local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y ==
                            local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x) {
                          std::vector<ZXing::PointT<double>,std::allocator<ZXing::PointT<double>>>::
                          _M_realloc_insert<ZXing::PointT<double>const&>
                                    ((vector<ZXing::PointT<double>,std::allocator<ZXing::PointT<double>>>
                                      *)&local_278,
                                     (iterator)
                                     local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y
                                     ,pPVar2);
                        }
                        else {
                          dVar46 = pPVar2->y;
                          *(double *)local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y
                               = pPVar2->x;
                          *(double *)
                           ((long)local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y +
                           8) = dVar46;
                          local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y =
                               (double)((long)local_278.super_array<ZXing::PointT<double>,_4UL>.
                                              _M_elems[0].y + 0x10);
                        }
                      }
                      uVar27 = uVar27 + 1;
                    } while (uVar11 != uVar27);
                    if (uVar19 != 1) {
                      uVar27 = 2;
                      do {
                        if (1 < (int)((ulong)((long)local_368.
                                                                                                        
                                                  super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)local_368.
                                                                                                      
                                                  super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4))
                        break;
                        uVar13 = -(uVar27 >> 1);
                        if ((uVar27 & 1) != 0) {
                          uVar13 = uVar27 >> 1;
                        }
                        if ((uVar13 + uVar12 < uVar19) &&
                           (lVar21 = (long)(int)((uVar13 + uVar12) * local_388._width + uVar34),
                           *(char *)((long)local_388._data.
                                           super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start +
                                    lVar21 * 0x18 + 0x10) == '\x01')) {
                          pPVar2 = (PointT<double> *)
                                   ((long)local_388._data.
                                          super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar21 * 0x18)
                          ;
                          if (local_368.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                              _M_impl.super__Vector_impl_data._M_finish ==
                              local_368.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage) {
                            std::vector<ZXing::PointT<double>,std::allocator<ZXing::PointT<double>>>
                            ::_M_realloc_insert<ZXing::PointT<double>const&>
                                      ((vector<ZXing::PointT<double>,std::allocator<ZXing::PointT<double>>>
                                        *)&local_368,
                                       (iterator)
                                       local_368.
                                       super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                                       _M_impl.super__Vector_impl_data._M_finish,pPVar2);
                          }
                          else {
                            dVar46 = pPVar2->y;
                            *(double *)
                             &(local_368.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>
                               ._M_impl.super__Vector_impl_data._M_finish)->x0 = pPVar2->x;
                            *(double *)
                             &(local_368.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>
                               ._M_impl.super__Vector_impl_data._M_finish)->y0 = dVar46;
                            local_368.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                            _M_impl.super__Vector_impl_data._M_finish =
                                 (pointer)((long)local_368.
                                                 super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish + 0x10);
                          }
                        }
                        uVar27 = uVar27 + 1;
                      } while (uVar11 != uVar27);
                    }
                  }
                  if ((((long)local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y -
                        (long)local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x &
                       0xffffffff0U) == 0x20) &&
                     (uVar38 = (long)local_368.
                                     super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)local_368.
                                     super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                                     _M_impl.super__Vector_impl_data._M_start & 0xffffffff0,
                     uVar38 == 0x20)) {
                    RegressionLine::RegressionLine<double>
                              ((RegressionLine *)local_2e8,
                               *(PointT<double> *)
                                local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x,
                               *(PointT<double> *)
                                ((long)local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[0]
                                       .x + 0x10));
                    iVar23 = (int)uVar38;
                    b.x = ((local_368.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                            _M_impl.super__Vector_impl_data._M_start)->mod2Pix).a11;
                    b.y = ((local_368.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                            _M_impl.super__Vector_impl_data._M_start)->mod2Pix).a12;
                    RegressionLine::RegressionLine<double>
                              (&local_228,
                               *(PointT<double> *)
                                local_368.
                                super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
                                super__Vector_impl_data._M_start,b);
                    auVar41._0_8_ =
                         (double)local_2d8._24_8_ * local_228.b +
                         -(double)local_2d8._32_8_ * local_228.a;
                    auVar45._0_8_ =
                         (double)local_2d8._40_8_ * local_228.b -
                         local_228.c * (double)local_2d8._32_8_;
                    auVar45._8_8_ =
                         (double)local_2d8._24_8_ * local_228.c -
                         local_228.a * (double)local_2d8._40_8_;
                    auVar41._8_8_ = auVar41._0_8_;
                    local_348 = (PointF)divpd(auVar45,auVar41);
                    local_58 = local_348;
                    if (local_228._points.
                        super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_228._points.
                                      super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_228._points.
                                            super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_228._points.
                                            super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (local_2e8 != (undefined1  [8])0x0) {
                      operator_delete((void *)local_2e8,local_2d8._0_8_ - (long)local_2e8);
                    }
                    LocateAlignmentPattern
                              ((optional<ZXing::PointT<double>_> *)local_2e8,(QRCode *)local_318,
                               (BitMatrix *)(ulong)local_334,iVar23,local_348);
                    pRVar17 = (RegressionLine *)&local_58;
                    if ((bool)local_2d8[0] != false) {
                      pRVar17 = (RegressionLine *)local_2e8;
                    }
                    lVar21 = (long)(int)(local_388._width * uVar12 + uVar34);
                    pPVar8 = (pRVar17->_points).
                             super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                    puVar30 = (undefined8 *)
                              ((long)local_388._data.
                                     super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar21 * 0x18);
                    *puVar30 = (pRVar17->_points).
                               super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    puVar30[1] = pPVar8;
                    *(undefined1 *)
                     ((long)local_388._data.
                            super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar21 * 0x18 + 0x10) = 1;
                  }
                  if (local_368.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_368.
                                    super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)local_368.
                                          super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_368.
                                          super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if ((PointT<double> *)
                      local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x !=
                      (PointT<double> *)0x0) {
                    operator_delete((void *)local_278.super_array<ZXing::PointT<double>,_4UL>.
                                            _M_elems[0].x,
                                    (long)local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems
                                          [1].x -
                                    (long)local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems
                                          [0].x);
                  }
                }
                uVar34 = uVar34 + 1;
              } while (uVar34 != uVar19);
              uVar12 = uVar12 + 1;
            } while (uVar12 != uVar19);
          }
        }
        lVar21 = (long)((local_388._width + 1) * (int)local_300);
        if ((*(byte *)((long)local_388._data.
                             super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar21 * 0x18 + 0x10) & 1)
            != 0) {
          puVar3 = (ulong *)((long)local_388._data.
                                   super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar21 * 0x18);
          local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].x = (double)*puVar3;
          local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].y = (double)puVar3[1];
          local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x =
               (local_330->tl).super_PointF.x;
          local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y =
               (local_330->tl).super_PointF.y;
          local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x =
               (local_330->tr).super_PointF.x;
          local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].y =
               (local_330->tr).super_PointF.y;
          local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].x =
               (local_330->bl).super_PointF.x;
          local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].y =
               (local_330->bl).super_PointF.y;
          local_228._points.
          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)((double)local_2f8.x + -3.5);
          local_228._points.
          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x400c000000000000;
          local_228._points.
          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl
          .super__Vector_impl_data._M_finish = (pointer)0x400c000000000000;
          local_228._directionInward.x = 3.5;
          local_228.b = 3.5;
          local_228._directionInward.y =
               (double)local_228._points.
                       super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + -3.0;
          local_228.a = local_228._directionInward.y;
          local_228.c = (value_t_conflict)
                        local_228._points.
                        super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
          PerspectiveTransform::PerspectiveTransform
                    ((PerspectiveTransform *)local_2e8,(QuadrilateralF *)&local_228,&local_278);
          pvVar29 = (value_t *)local_2e8;
          pPVar31 = &local_1e0;
          for (lVar21 = 9; lVar21 != 0; lVar21 = lVar21 + -1) {
            pPVar31->a11 = *pvVar29;
            pvVar29 = pvVar29 + (ulong)bVar40 * -2 + 1;
            pPVar31 = (PerspectiveTransform *)((long)pPVar31 + ((ulong)bVar40 * -2 + 1) * 8);
          }
        }
        if ((int)uVar19 < 1) {
          local_368.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_368.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
          super__Vector_impl_data._M_finish = (ROI *)0x0;
          local_368.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (ROI *)0x0;
        }
        else {
          uVar38 = 0;
          do {
            uVar37 = 0;
            do {
              if (*(char *)((long)local_388._data.
                                  super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start +
                           (long)(local_388._width * (int)uVar38 + (int)uVar37) * 0x18 + 0x10) ==
                  '\0') {
                piVar7 = (pVVar14->_alignmentPatternCenters).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                p_06.x = (double)piVar7[uVar37] + 0.5;
                p_06.y = (double)piVar7[uVar38] + 0.5;
                PVar50 = PerspectiveTransform::operator()(&local_1e0,p_06);
                lVar21 = (long)(local_388._width * (int)uVar38 + (int)uVar37);
                *(double *)
                 ((long)local_388._data.
                        super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar21 * 0x18) = PVar50.x;
                *(double *)
                 ((long)local_388._data.
                        super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar21 * 0x18 + 8) = PVar50.y;
                *(undefined1 *)
                 ((long)local_388._data.
                        super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar21 * 0x18 + 0x10) = 1;
              }
              uVar37 = uVar37 + 1;
            } while ((uVar19 & 0x7fffffff) != uVar37);
            uVar38 = uVar38 + 1;
          } while (uVar38 != (uVar19 & 0x7fffffff));
          local_368.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_368.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
          super__Vector_impl_data._M_finish = (ROI *)0x0;
          local_368.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (ROI *)0x0;
          if (uVar19 != 1) {
            local_328 = (BitMatrix *)(local_300 & 0xffffffff);
            local_348.x._0_4_ = 1;
            pBVar36 = (BitMatrix *)0x0;
            do {
              pBVar4 = (BitMatrix *)((long)&pBVar36->_width + 1);
              iVar23 = 0;
              if (pBVar36 == (BitMatrix *)0x0) {
                iVar23 = -6;
              }
              iVar18 = 0;
              if (pBVar36 == (BitMatrix *)(ulong)(uVar19 - 2)) {
                iVar18 = 7;
              }
              pBVar28 = (BitMatrix *)0x0;
              do {
                piVar7 = (pVVar14->_alignmentPatternCenters).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                iVar33 = piVar7[(long)pBVar28];
                iVar10 = piVar7[(long)((long)&pBVar28->_width + 1)];
                local_2e8._0_4_ = iVar33 + -6;
                if (pBVar28 != (BitMatrix *)0x0) {
                  local_2e8._0_4_ = iVar33;
                }
                local_2e8._4_4_ = iVar10 + 7;
                if ((BitMatrix *)(ulong)(uVar19 - 2) != pBVar28) {
                  local_2e8._4_4_ = iVar10;
                }
                uStack_2e0._4_4_ = piVar7[(long)pBVar4] + iVar18;
                uStack_2e0._0_4_ = piVar7[(long)pBVar36] + iVar23;
                local_228._points.
                super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)((double)iVar33 + 0.5);
                local_228._points.
                super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     (pointer)((double)piVar7[(long)pBVar36] + 0.5);
                local_228._points.
                super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((double)iVar10 + 0.5);
                local_228.a = (double)piVar7[(long)pBVar4] + 0.5;
                iVar20 = (int)pBVar36 * local_388._width;
                iVar33 = (int)pBVar28;
                iVar10 = local_388._width * local_348.x._0_4_ + iVar33;
                puVar30 = (undefined8 *)
                          ((long)local_388._data.
                                 super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start +
                          (long)(iVar20 + iVar33) * 0x18);
                local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x = (double)*puVar30;
                local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y = (double)puVar30[1]
                ;
                pdVar1 = (double *)
                         ((long)local_388._data.
                                super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start +
                         (long)(iVar20 + iVar33 + 1) * 0x18);
                local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x = *pdVar1;
                local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].y = pdVar1[1];
                puVar3 = (ulong *)((long)local_388._data.
                                         super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start +
                                  (long)(iVar10 + 1) * 0x18);
                local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].x = (double)*puVar3;
                local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].y = (double)puVar3[1];
                pdVar1 = (double *)
                         ((long)local_388._data.
                                super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + (long)iVar10 * 0x18);
                local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].x = *pdVar1;
                local_278.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].y = pdVar1[1];
                local_228._directionInward.x =
                     (double)local_228._points.
                             super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                local_228._directionInward.y =
                     (double)local_228._points.
                             super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_228.b = (value_t_conflict)
                              local_228._points.
                              super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                local_228.c = local_228.a;
                PerspectiveTransform::PerspectiveTransform
                          ((PerspectiveTransform *)local_2d8,(QuadrilateralF *)&local_228,&local_278
                          );
                if (local_368.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_368.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<ZXing::ROI,_std::allocator<ZXing::ROI>_>::
                  _M_realloc_insert<ZXing::ROI>
                            (&local_368,
                             (iterator)
                             local_368.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                             _M_impl.super__Vector_impl_data._M_finish,(ROI *)local_2e8);
                }
                else {
                  puVar30 = (undefined8 *)local_2e8;
                  pRVar32 = local_368.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                  for (lVar21 = 0xb; lVar21 != 0; lVar21 = lVar21 + -1) {
                    uVar5 = *puVar30;
                    pRVar32->x0 = (int)uVar5;
                    pRVar32->x1 = (int)((ulong)uVar5 >> 0x20);
                    puVar30 = puVar30 + (ulong)bVar40 * -2 + 1;
                    pRVar32 = (ROI *)((long)pRVar32 + (ulong)bVar40 * -0x10 + 8);
                  }
                  local_368.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_368.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl
                       .super__Vector_impl_data._M_finish + 1;
                }
                pBVar28 = (BitMatrix *)((long)&pBVar28->_width + 1);
              } while (local_328 != pBVar28);
              local_348.x._0_4_ = local_348.x._0_4_ + 1;
              pBVar36 = pBVar4;
            } while (pBVar4 != local_328);
          }
        }
        __return_storage_ptr__ = local_288;
        SampleGrid(local_288,local_318,local_2f8.x,local_2f8.x,&local_368);
        if (local_368.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_368.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_368.
                                super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_368.
                                super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((PointF *)
            local_388._data.
            super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (PointF *)0x0) {
          operator_delete(local_388._data.
                          super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_388._data.
                                super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_388._data.
                                super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        goto LAB_00185140;
      }
    }
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->_bits)._width = 0;
    (__return_storage_ptr__->_bits)._height = 0;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
  }
LAB_00185140:
  if (local_168._points.
      super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168._points.
                    super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_168._points.
                          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_168._points.
                          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_128._points.
      super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128._points.
                    super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_128._points.
                          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128._points.
                          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8._points.
      super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8._points.
                    super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8._points.
                          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8._points.
                          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a8._points.
      super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8._points.
                    super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8._points.
                          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8._points.
                          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

DetectorResult SampleQR(const BitMatrix& image, const FinderPatternSet& fp)
{
	auto top  = EstimateDimension(image, fp.tl, fp.tr);
	auto left = EstimateDimension(image, fp.tl, fp.bl);

	if (!top.dim && !left.dim)
		return {};

	auto best = top.err == left.err ? (top.dim > left.dim ? top : left) : (top.err < left.err ? top : left);
	int dimension = best.dim;
	int moduleSize = static_cast<int>(best.ms + 1);

	auto br = PointF{-1, -1};
	auto brOffset = PointF{3, 3};

	// Everything except version 1 (21 modules) has an alignment pattern. Estimate the center of that by intersecting
	// line extensions of the 1 module wide square around the finder patterns. This could also help with detecting
	// slanted symbols of version 1.

	// generate 4 lines: outer and inner edge of the 1 module wide black line between the two outer and the inner
	// (tl) finder pattern
	auto bl2 = TraceLine(image, fp.bl, fp.tl, 2);
	auto bl3 = TraceLine(image, fp.bl, fp.tl, 3);
	auto tr2 = TraceLine(image, fp.tr, fp.tl, 2);
	auto tr3 = TraceLine(image, fp.tr, fp.tl, 3);

	if (bl2.isValid() && tr2.isValid() && bl3.isValid() && tr3.isValid()) {
		// intersect both outer and inner line pairs and take the center point between the two intersection points
		auto brInter = (intersect(bl2, tr2) + intersect(bl3, tr3)) / 2;
		log(brInter, 3);

		if (dimension > 21)
			if (auto brCP = LocateAlignmentPattern(image, moduleSize, brInter))
				br = *brCP;

		// if the symbol is tilted or the resolution of the RegressionLines is sufficient, use their intersection
		// as the best estimate (see discussion in #199 and test image estimate-tilt.jpg )
		if (!image.isIn(br) && (EstimateTilt(fp) > 1.1 || (bl2.isHighRes() && bl3.isHighRes() && tr2.isHighRes() && tr3.isHighRes())))
			br = brInter;
	}

	// otherwise the simple estimation used by upstream is used as a best guess fallback
	if (!image.isIn(br)) {
		br = fp.tr - fp.tl + fp.bl;
		brOffset = PointF(0, 0);
	}

	log(br, 3);
	auto mod2Pix = Mod2Pix(dimension, brOffset, {fp.tl, fp.tr, br, fp.bl});

	if( dimension >= Version::SymbolSize(7, Type::Model2).x) {
		auto version = ReadVersion(image, dimension, mod2Pix);

		// if the version bits are garbage -> discard the detection
		if (!version || std::abs(version->dimension() - dimension) > 8)
			return DetectorResult();
		if (version->dimension() != dimension) {
			printf("update dimension: %d -> %d\n", dimension, version->dimension());
			dimension = version->dimension();
			mod2Pix = Mod2Pix(dimension, brOffset, {fp.tl, fp.tr, br, fp.bl});
		}
#if 1
		auto& apM = version->alignmentPatternCenters(); // alignment pattern positions in modules
		auto apP = Matrix<std::optional<PointF>>(Size(apM), Size(apM)); // found/guessed alignment pattern positions in pixels
		const int N = Size(apM) - 1;

		// project the alignment pattern at module coordinates x/y to pixel coordinate based on current mod2Pix
		auto projectM2P = [&mod2Pix, &apM](int x, int y) { return mod2Pix(centered(PointI(apM[x], apM[y]))); };

		auto findInnerCornerOfConcentricPattern = [&image, &apP, &projectM2P](int x, int y, const ConcentricPattern& fp) {
			auto pc = *apP.set(x, y, projectM2P(x, y));
			if (auto fpQuad = FindConcentricPatternCorners(image, fp, fp.size, 2))
				for (auto c : *fpQuad)
					if (distance(c, pc) < fp.size / 2)
						apP.set(x, y, c);
		};

		findInnerCornerOfConcentricPattern(0, 0, fp.tl);
		findInnerCornerOfConcentricPattern(0, N, fp.bl);
		findInnerCornerOfConcentricPattern(N, 0, fp.tr);

		auto bestGuessAPP = [&](int x, int y){
			if (auto p = apP(x, y))
				return *p;
			return projectM2P(x, y);
		};

		for (int y = 0; y <= N; ++y)
			for (int x = 0; x <= N; ++x) {
				if (apP(x, y))
					continue;

				PointF guessed =
					x * y == 0 ? bestGuessAPP(x, y) : bestGuessAPP(x - 1, y) + bestGuessAPP(x, y - 1) - bestGuessAPP(x - 1, y - 1);
				if (auto found = LocateAlignmentPattern(image, moduleSize, guessed))
					apP.set(x, y, *found);
			}

		// go over the whole set of alignment patters again and try to fill any remaining gap by using available neighbors as guides
		for (int y = 0; y <= N; ++y)
			for (int x = 0; x <= N; ++x) {
				if (apP(x, y))
					continue;

				// find the two closest valid alignment pattern pixel positions both horizontally and vertically
				std::vector<PointF> hori, verti;
				for (int i = 2; i < 2 * N + 2 && Size(hori) < 2; ++i) {
					int xi = x + i / 2 * (i%2 ? 1 : -1);
					if (0 <= xi && xi <= N && apP(xi, y))
						hori.push_back(*apP(xi, y));
				}
				for (int i = 2; i < 2 * N + 2 && Size(verti) < 2; ++i) {
					int yi = y + i / 2 * (i%2 ? 1 : -1);
					if (0 <= yi && yi <= N && apP(x, yi))
						verti.push_back(*apP(x, yi));
				}

				// if we found 2 each, intersect the two lines that are formed by connecting the point pairs
				if (Size(hori) == 2 && Size(verti) == 2) {
					auto guessed = intersect(RegressionLine(hori[0], hori[1]), RegressionLine(verti[0], verti[1]));
					auto found = LocateAlignmentPattern(image, moduleSize, guessed);
					// search again near that intersection and if the search fails, use the intersection
					if (!found) printf("location guessed at %dx%d\n", x, y);
					apP.set(x, y, found ? *found : guessed);
				}
			}

		if (auto c = apP.get(N, N))
			mod2Pix = Mod2Pix(dimension, PointF(3, 3), {fp.tl, fp.tr, *c, fp.bl});

		// go over the whole set of alignment patters again and fill any remaining gaps by a projection based on an updated mod2Pix
		// projection. This works if the symbol is flat, wich is a reasonable fall-back assumption.
		for (int y = 0; y <= N; ++y)
			for (int x = 0; x <= N; ++x) {
				if (apP(x, y))
					continue;

				printf("locate failed at %dx%d\n", x, y);
				apP.set(x, y, projectM2P(x, y));
			}

#ifdef PRINT_DEBUG
		for (int y = 0; y <= N; ++y)
			for (int x = 0; x <= N; ++x)
				log(*apP(x, y), 2);
#endif

		// assemble a list of region-of-interests based on the found alignment pattern pixel positions
		ROIs rois;
		for (int y = 0; y < N; ++y)
			for (int x = 0; x < N; ++x) {
				int x0 = apM[x], x1 = apM[x + 1], y0 = apM[y], y1 = apM[y + 1];
				rois.push_back({x0 - (x == 0) * 6, x1 + (x == N - 1) * 7, y0 - (y == 0) * 6, y1 + (y == N - 1) * 7,
								PerspectiveTransform{Rectangle(x0, x1, y0, y1),
													 {*apP(x, y), *apP(x + 1, y), *apP(x + 1, y + 1), *apP(x, y + 1)}}});
			}

		return SampleGrid(image, dimension, dimension, rois);
#endif
	}

	return SampleGrid(image, dimension, dimension, mod2Pix);
}